

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

stb_ps * stb_ps_remove(stb_ps *ps,void *value)

{
  uint uVar1;
  int iVar2;
  stb_ps_bucket *psVar3;
  stb_ps *psVar4;
  stb_ps *old_data;
  int *piVar5;
  stb_ps_hash *psVar6;
  char cVar7;
  stb_ps *local_98;
  stb_ps_hash *h2;
  int j;
  int i_1;
  stb_ps_array *a_1;
  int n_1;
  void **t;
  stb_uint32 n;
  stb_uint32 s;
  stb_uint32 hash;
  stb_ps_hash *h;
  stb_ps_bucket *b_1;
  int i;
  stb_ps_array *a;
  int count;
  stb_ps_bucket *b;
  void *value_local;
  stb_ps *ps_local;
  
  if (((ulong)value & 3) != 0) {
    __assert_fail("(3 & (int) value) == STB_ps_direct",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0x1e7a,"stb_ps *stb_ps_remove(stb_ps *, void *)");
  }
  ps_local = ps;
  if (value != (void *)0x0) {
    value_local._0_4_ = (uint)ps;
    switch((uint)value_local & 3) {
    case 0:
      local_98 = ps;
      if (ps == (stb_ps *)value) {
        local_98 = (stb_ps *)0x0;
      }
      ps_local = local_98;
      break;
    case 1:
      psVar4 = ps + -1;
      cVar7 = false;
      if (*(void **)psVar4 == value) {
        *(undefined8 *)psVar4 = 0;
      }
      else {
        cVar7 = *(long *)psVar4 != 0;
      }
      if (*(void **)(ps + 7) == value) {
        *(undefined8 *)(ps + 7) = 0;
      }
      else {
        cVar7 = (*(long *)(ps + 7) != 0) + cVar7;
      }
      if (*(void **)(ps + 0xf) == value) {
        *(undefined8 *)(ps + 0xf) = 0;
      }
      else {
        cVar7 = (*(long *)(ps + 0xf) != 0) + cVar7;
      }
      if (*(void **)(ps + 0x17) == value) {
        *(undefined8 *)(ps + 0x17) = 0;
      }
      else {
        cVar7 = (*(long *)(ps + 0x17) != 0) + cVar7;
      }
      if (cVar7 == '\x01') {
        b = *(stb_ps_bucket **)psVar4;
        if (b == (stb_ps_bucket *)0x0) {
          b = *(stb_ps_bucket **)(ps + 7);
        }
        if (b == (stb_ps_bucket *)0x0) {
          b = *(stb_ps_bucket **)(ps + 0xf);
        }
        if (b == (stb_ps_bucket *)0x0) {
          b = *(stb_ps_bucket **)(ps + 0x17);
        }
        if (b == (stb_ps_bucket *)0x0) {
          __assert_fail("value != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0x1e8c,"stb_ps *stb_ps_remove(stb_ps *, void *)");
        }
        stb_bucket_free((stb_ps_bucket *)psVar4);
        ps_local = (stb_ps *)b;
      }
      break;
    case 2:
      psVar4 = ps + -2;
      for (b_1._4_4_ = 0; b_1._4_4_ < *(int *)psVar4; b_1._4_4_ = b_1._4_4_ + 1) {
        if (*(void **)(ps + (long)b_1._4_4_ * 8 + 6) == value) {
          iVar2 = *(int *)psVar4;
          *(int *)psVar4 = iVar2 + -1;
          *(undefined8 *)(ps + (long)b_1._4_4_ * 8 + 6) =
               *(undefined8 *)(ps + (long)(iVar2 + -1) * 8 + 6);
          if (*(int *)psVar4 != 3) {
            return ps;
          }
          psVar3 = stb_bucket_create3((void **)(ps + 6));
          free(psVar4);
          return (stb_ps *)((long)psVar3->p + 1);
        }
      }
      break;
    case 3:
      psVar4 = ps + -3;
      uVar1 = stb_hashptr(value);
      t._4_4_ = uVar1 & *(uint *)(ps + 1);
      old_data = ps + 0x1d;
      if (*(void **)(old_data + (ulong)t._4_4_ * 8) != value) {
        do {
          t._4_4_ = t._4_4_ + (uVar1 + (uVar1 >> 6) + (uVar1 >> 0x13) | 1) & *(uint *)(ps + 1);
        } while (*(void **)(old_data + (ulong)t._4_4_ * 8) != value);
      }
      *(undefined1 **)(old_data + (ulong)t._4_4_ * 8) = &DAT_00000001;
      *(int *)(ps + 5) = *(int *)(ps + 5) + -1;
      *(int *)(ps + 9) = *(int *)(ps + 9) + 1;
      if (*(int *)(ps + 5) < stb_ps_array_max) {
        iVar2 = stb_log2_floor(stb_ps_array_max);
        iVar2 = 1 << ((byte)iVar2 & 0x1f);
        if (*(int *)(ps + 5) < iVar2) {
          piVar5 = (int *)malloc((long)(iVar2 + -1) * 8 + 0x10);
          h2._0_4_ = 0;
          for (h2._4_4_ = 0; h2._4_4_ < *(int *)psVar4; h2._4_4_ = h2._4_4_ + 1) {
            if (1 < (uint)*(undefined8 *)(old_data + (long)h2._4_4_ * 8)) {
              *(undefined8 *)(piVar5 + (long)(int)h2 * 2 + 2) =
                   *(undefined8 *)(old_data + (long)h2._4_4_ * 8);
              h2._0_4_ = (int)h2 + 1;
            }
          }
          if ((int)h2 == *(int *)(ps + 5)) {
            *piVar5 = (int)h2;
            free(psVar4);
            return (stb_ps *)((long)piVar5 + 2);
          }
          __assert_fail("j == h->count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0x1eb9,"stb_ps *stb_ps_remove(stb_ps *, void *)");
        }
      }
      if (*(int *)(ps + 5) == *(int *)(ps + 0x11)) {
        psVar6 = stb_ps_makehash(*(int *)psVar4 >> 1,*(int *)psVar4,(void **)old_data);
        free(psVar4);
        ps_local = (stb_ps *)((long)&psVar6->size + 3);
      }
    }
  }
  return ps_local;
}

Assistant:

stb_ps *stb_ps_remove(stb_ps *ps, void *value)
{
   #ifdef STB_DEBUG
   assert(stb_ps_find(ps, value));
   #endif
   assert((3 & (int) value) == STB_ps_direct);
   if (value == NULL) return ps; // ignore NULL removes to avoid bad breakage
   switch (3 & (int) ps) {
      case STB_ps_direct:
         return ps == value ? NULL : ps;
      case STB_ps_bucket: {
         stb_ps_bucket *b = GetBucket(ps);
         int count=0;
         assert(STB_BUCKET_SIZE == 4);
         if (b->p[0] == value) b->p[0] = NULL; else count += (b->p[0] != NULL);
         if (b->p[1] == value) b->p[1] = NULL; else count += (b->p[1] != NULL);
         if (b->p[2] == value) b->p[2] = NULL; else count += (b->p[2] != NULL);
         if (b->p[3] == value) b->p[3] = NULL; else count += (b->p[3] != NULL);
         if (count == 1) { // shrink bucket at size 1
            value = b->p[0];
            if (value == NULL) value = b->p[1];
            if (value == NULL) value = b->p[2];
            if (value == NULL) value = b->p[3];
            assert(value != NULL);
            stb_bucket_free(b);
            return (stb_ps *) value; // return STB_ps_direct of value
         }
         return ps;
      }
      case STB_ps_array: {
         stb_ps_array *a = GetArray(ps);
         int i;
         for (i=0; i < a->count; ++i) {
            if (a->p[i] == value) {
               a->p[i] = a->p[--a->count];
               if (a->count == 3) { // shrink to bucket!
                  stb_ps_bucket *b = stb_bucket_create3(a->p);
                  free(a);
                  return EncodeBucket(b);
               }
               return ps;
            }
         }
         return ps;
      }
      case STB_ps_hash: {
         stb_ps_hash *h = GetHash(ps);
         stb_uint32 hash = stb_hashptr(value);
         stb_uint32 s, n = hash & h->mask;
         void **t = h->table;
         if (t[n] != value) {
            s = stb_rehash(hash) | 1;
            do {
               n = (n + s) & h->mask;
            } while (t[n] != value);
         }
         t[n] = STB_DEL;
         -- h->count;
         ++ h->count_deletes;
         // should we shrink down to an array?
         if (h->count < stb_ps_array_max) {
            int n = 1 << stb_log2_floor(stb_ps_array_max);
            if (h->count < n) {
               stb_ps_array *a = (stb_ps_array *) malloc(sizeof(*a) + (n-1) * sizeof(a->p[0]));
               int i,j=0;
               for (i=0; i < h->size; ++i)
                  if (!stb_ps_empty(t[i]))
                     a->p[j++] = t[i];
               assert(j == h->count);
               a->count = j;
               free(h);
               return EncodeArray(a);
            }
         }
         if (h->count == h->shrink_threshhold) {
            stb_ps_hash *h2 = stb_ps_makehash(h->size >> 1, h->size, t);
            free(h);
            return EncodeHash(h2);
         }
         return ps;
      }
   }
   return ps; /* NOTREACHED */
}